

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
pstore::broker::command_processor::process_command
          (command_processor *this,fifo_path *fifo,message_type *msg)

{
  _func_int *__s2;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> nVar1;
  int iVar2;
  undefined8 uVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar6;
  gc_watch_thread *pgVar7;
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  command;
  undefined1 local_50 [16];
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_40;
  not_null<std::atomic<bool>_*> local_38;
  ulong uVar5;
  
  parse((command_processor *)local_50,(message_type *)this);
  if ((tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
      )local_50._0_8_ != (_Head_base<0UL,_pstore::broker::broker_command_*,_false>)0x0) {
    local_50._8_8_ = fifo;
    (*this->_vptr_command_processor[9])(this,local_50._0_8_);
    local_40.ptr_ = (maybe<pstore::http::server_status,_void> *)local_50._0_8_;
    __s2 = *(_func_int **)local_50._0_8_;
    pgVar7 = (gc_watch_thread *)&commands_;
    uVar5 = 6;
    do {
      uVar4 = uVar5 >> 1;
      iVar2 = strcmp((char *)(&pgVar7->mut_)[uVar4].super___mutex_base._M_mutex.__data.__list.__prev
                     ,(char *)__s2);
      nVar1.ptr_ = local_40.ptr_;
      uVar6 = uVar4;
      if (iVar2 < 0) {
        uVar6 = ~uVar4 + uVar5;
        pgVar7 = (gc_watch_thread *)
                 &(&pgVar7->mut_)[uVar4].super___mutex_base._M_mutex.__data.__list.__next;
      }
      uVar5 = uVar6;
    } while (0 < (long)uVar6);
    if (pgVar7 != &getgc::gc) {
      iVar2 = std::__cxx11::string::compare(&(local_40.ptr_)->valid_);
      if (iVar2 == 0) {
        local_38.ptr_ = (atomic<bool> *)this;
        if (*(long *)((long)&(pgVar7->mut_).super___mutex_base._M_mutex + 8) == 0) {
          uVar3 = std::__throw_bad_function_call();
          std::
          unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
          ::~unique_ptr((unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
                         *)local_50);
          _Unwind_Resume(uVar3);
        }
        (**(code **)((long)&(pgVar7->mut_).super___mutex_base._M_mutex + 0x10))
                  (pgVar7,&local_38,local_50._8_8_,nVar1.ptr_);
        goto LAB_00119b78;
      }
    }
    (*this->_vptr_command_processor[8])(this,nVar1.ptr_);
  }
LAB_00119b78:
  std::
  unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>::
  ~unique_ptr((unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
               *)local_50);
  return;
}

Assistant:

void command_processor::process_command (brokerface::fifo_path const & fifo,
                                                 brokerface::message_type const & msg) {
            auto const command = this->parse (msg);
            if (broker_command const * const c = command.get ()) {
                this->log (*c);
                auto const pos = std::lower_bound (std::begin (commands_), std::end (commands_),
                                                   command_entry (c->verb.c_str (), nullptr),
                                                   command_entry_compare);
                if (pos != std::end (commands_) && c->verb == std::get<gsl::czstring> (*pos)) {
                    std::get<handler> (*pos) (this, fifo, *c);
                } else {
                    this->unknown (*c);
                }
            }
        }